

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

bool __thiscall cmCursesMainForm::LookForCacheEntry(cmCursesMainForm *this,string *key)

{
  iterator __first;
  iterator __last;
  bool local_31;
  string *key_local;
  cmCursesMainForm *this_local;
  
  local_31 = false;
  if (this->Entries !=
      (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *)0x0)
  {
    __first = std::
              vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              ::begin(this->Entries);
    __last = std::
             vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
             end(this->Entries);
    local_31 = std::
               any_of<__gnu_cxx::__normal_iterator<cmCursesCacheEntryComposite**,std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>>,cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                         ((__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                           )__first._M_current,
                          (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                           )__last._M_current,(anon_class_8_1_ba1d59bf_for__M_pred)key);
  }
  return local_31;
}

Assistant:

bool cmCursesMainForm::LookForCacheEntry(const std::string& key)
{
  return this->Entries &&
    std::any_of(this->Entries->begin(), this->Entries->end(),
                [&key](cmCursesCacheEntryComposite* entry) {
                  return key == entry->Key;
                });
}